

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

void Cloud_Restart(CloudManager *dd)

{
  int iVar1;
  CloudNode **ppCVar2;
  CloudSign CVar3;
  long lVar4;
  
  CVar3 = dd->one->s;
  if (CVar3 == dd->nSignCur) {
    CVar3 = CVar3 + 1;
    dd->nSignCur = CVar3;
    dd->one->s = CVar3;
    iVar1 = dd->nVars;
    if (0 < (long)iVar1) {
      ppCVar2 = dd->vars;
      lVar4 = 0;
      do {
        ppCVar2[lVar4]->s = ppCVar2[lVar4]->s + 1;
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    dd->nNodesCur = iVar1 + 1;
    return;
  }
  __assert_fail("dd->one->s == dd->nSignCur",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/kit/cloud.c"
                ,0xa9,"void Cloud_Restart(CloudManager *)");
}

Assistant:

void Cloud_Restart( CloudManager * dd )
{
    int i;
    assert( dd->one->s == dd->nSignCur );
    dd->nSignCur++;
    dd->one->s++;
	for ( i = 0; i < dd->nVars; i++ )
		dd->vars[i]->s++;
    dd->nNodesCur = 1 + dd->nVars;
}